

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereExprUsageFull(WhereMaskSet *pMaskSet,Expr *p)

{
  ulong uVar1;
  Bitmask BVar2;
  ulong uVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  
  if (p->op == 0xb3) {
    uVar1 = sqlite3WhereGetMask(pMaskSet,p->iTable);
  }
  else {
    uVar1 = 0;
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    uVar1 = uVar1 | BVar2;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xc & 1) == 0) {
      if ((p->x).pList == (ExprList *)0x0) goto LAB_0018a1b5;
      uVar3 = sqlite3WhereExprListUsage(pMaskSet,(p->x).pList);
    }
    else {
      if ((p->flags & 0x40) != 0) {
        pMaskSet->bVarSelect = 1;
      }
      uVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
    }
  }
  else {
    uVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  uVar1 = uVar1 | uVar3;
LAB_0018a1b5:
  if (((p->op == 0xac) || (p->op == 0xa9)) && ((p->flags & 0x1000000) != 0)) {
    BVar2 = sqlite3WhereExprListUsage(pMaskSet,((p->y).pWin)->pPartition);
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,((p->y).pWin)->pOrderBy);
    BVar5 = sqlite3WhereExprUsage(pMaskSet,((p->y).pWin)->pFilter);
    uVar1 = BVar5 | uVar1 | BVar4 | BVar2;
  }
  return uVar1;
}

Assistant:

static SQLITE_NOINLINE Bitmask sqlite3WhereExprUsageFull(
  WhereMaskSet *pMaskSet,
  Expr *p
){
  Bitmask mask;
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprUseXSelect(p) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( (p->op==TK_FUNCTION || p->op==TK_AGG_FUNCTION) && ExprUseYWin(p) ){
    assert( p->y.pWin!=0 );
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, p->y.pWin->pFilter);
  }
#endif
  return mask;
}